

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

int coda_random_init(void)

{
  int __fd;
  ssize_t sVar1;
  uint32_t rnd_from_device;
  
  if (coda_random_inited != 0) {
    return 0;
  }
  __fd = open64("/dev/urandom",0);
  if ((-1 < __fd) && (sVar1 = read(__fd,&rnd_from_device,4), -1 < (int)sVar1)) {
    close(__fd);
    srandom(rnd_from_device);
    coda_random_inited = 1;
    return 0;
  }
  return -1;
}

Assistant:

int coda_random_init()
{
	if (coda_random_inited)
	{
		return 0;
	}

	int fd = open("/dev/urandom", O_RDONLY);
	if (0 > fd) return -1;

	uint32_t rnd_from_device;

	int rc = read(fd, &rnd_from_device, sizeof(rnd_from_device));
	if (0 > rc) return -1;

	close(fd);

	srandom(rnd_from_device);
	coda_random_inited = 1;

	return 0;
}